

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cpp
# Opt level: O1

vector<field::GF2E,_std::allocator<field::GF2E>_> *
operator*(vector<field::GF2E,_std::allocator<field::GF2E>_> *__return_storage_ptr__,
         vector<field::GF2E,_std::allocator<field::GF2E>_> *lhs,
         vector<field::GF2E,_std::allocator<field::GF2E>_> *rhs)

{
  ulong *puVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  pointer pGVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  allocator_type local_48 [24];
  
  std::vector<field::GF2E,_std::allocator<field::GF2E>_>::vector
            (__return_storage_ptr__,
             (((long)(lhs->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(lhs->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 3) +
             ((long)(rhs->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(rhs->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 3)) - 1,local_48);
  if ((lhs->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (lhs->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    lVar7 = 0;
    uVar8 = 0;
    do {
      pGVar5 = (rhs->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((rhs->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl.
          super__Vector_impl_data._M_finish != pGVar5) {
        uVar9 = 0;
        do {
          auVar3._8_8_ = 0;
          auVar3._0_8_ = pGVar5[uVar9].data;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = (lhs->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>).
                         _M_impl.super__Vector_impl_data._M_start[uVar8].data;
          local_48._0_16_ = (undefined1  [16])0x0;
          for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
            if ((auVar3 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
              local_48._0_16_ = local_48._0_16_ ^ auVar4 << uVar2;
            }
          }
          if (field::GF2E::reduce._16_8_ == 0) {
            std::__throw_bad_function_call();
          }
          uVar6 = (*(code *)field::GF2E::reduce._24_8_)(field::GF2E::reduce,local_48);
          puVar1 = (ulong *)((long)&(__return_storage_ptr__->
                                    super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>).
                                    _M_impl.super__Vector_impl_data._M_start[uVar9].data + lVar7);
          *puVar1 = *puVar1 ^ uVar6;
          uVar9 = uVar9 + 1;
          pGVar5 = (rhs->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        } while (uVar9 < (ulong)((long)(rhs->
                                       super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)pGVar5 >>
                                3));
      }
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 8;
    } while (uVar8 < (ulong)((long)(lhs->
                                   super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(lhs->
                                   super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>).
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<field::GF2E> operator*(const std::vector<field::GF2E> &lhs,
                                   const std::vector<field::GF2E> &rhs) {

  std::vector<field::GF2E> result(lhs.size() + rhs.size() - 1);
  for (size_t i = 0; i < lhs.size(); i++)
    for (size_t j = 0; j < rhs.size(); j++)
      result[i + j] += lhs[i] * rhs[j];

  return result;
}